

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

void rt_pa_set_source_info_and_quit(pa_context *param_1,pa_source_info *i,int eol,void *userdata)

{
  byte bVar1;
  uint uVar2;
  vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> *this;
  __type _Var3;
  bool bVar4;
  rtaudio_pa_format_mapping_t *fm;
  char *pcVar5;
  reference pvVar6;
  rtaudio_pa_format_mapping_t *prVar7;
  reference pvVar8;
  uint *sr;
  uint *puVar9;
  ulong __n;
  string name;
  PaDeviceInfo painfo;
  DeviceInfo info;
  
  if (eol != 0) {
    (**(code **)(*userdata + 0x68))(*userdata,0);
    return;
  }
  pcVar5 = (char *)pa_proplist_gets(i->proplist,"device.description");
  std::__cxx11::string::string((string *)&name,pcVar5,(allocator *)&info);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)userdata + 0x58),&name);
  __n = 0;
  do {
    this = *(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
            ((long)userdata + 0x78);
    if ((ulong)(((long)(this->
                       super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->
                      super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>)
                      ._M_impl.super__Vector_impl_data._M_start) / 0x60) <= __n) {
      info.ID = 0;
      info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
      info.name._M_string_length = 0;
      info.name.field_2._M_local_buf[0] = '\0';
      info.outputChannels = 0;
      info.inputChannels._0_2_ = 0;
      info.inputChannels._2_2_ = 0;
      info.duplexChannels = 0;
      info.isDefaultOutput = false;
      info.isDefaultInput = false;
      info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      info.currentSampleRate = 0;
      info.preferredSampleRate = 0;
      info.nativeFormats = 0;
      std::__cxx11::string::_M_assign((string *)&info.name);
      info.inputChannels._1_1_ = 0;
      info.inputChannels._0_1_ = (i->sample_spec).channels;
      info.inputChannels._2_2_ = 0;
      info.preferredSampleRate = (i->sample_spec).rate;
      info.isDefaultInput =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)userdata + 0x28),i->name);
      for (puVar9 = SUPPORTED_SAMPLERATES; *puVar9 != 0; puVar9 = puVar9 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&info.sampleRates,puVar9);
      }
      for (prVar7 = supported_sampleformats; prVar7->rtaudio_format != 0; prVar7 = prVar7 + 1) {
        info.nativeFormats = info.nativeFormats | prVar7->rtaudio_format;
      }
      info.ID = **(uint **)((long)userdata + 0x50);
      **(uint **)((long)userdata + 0x50) = info.ID + 1;
      std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::push_back
                (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                  ((long)userdata + 0x78),&info);
      painfo.sinkName._M_dataplus._M_p = (pointer)&painfo.sinkName.field_2;
      painfo.sinkName._M_string_length = 0;
      painfo.sinkName.field_2._M_local_buf[0] = '\0';
      painfo.sourceName._M_dataplus._M_p = (pointer)&painfo.sourceName.field_2;
      painfo.sourceName._M_string_length = 0;
      painfo.sourceName.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)&painfo.sourceName);
      std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::push_back
                (*(vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_> **)
                  ((long)userdata + 0x70),&painfo);
      RtApiPulse::PaDeviceInfo::~PaDeviceInfo(&painfo);
      RtAudio::DeviceInfo::~DeviceInfo(&info);
LAB_00111a13:
      std::__cxx11::string::~string((string *)&name);
      return;
    }
    pvVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at(this,__n);
    _Var3 = std::operator==(&pvVar6->name,&name);
    if (_Var3) {
      pvVar8 = std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::at
                         (*(vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>
                            **)((long)userdata + 0x70),__n);
      if ((pvVar8->sinkName)._M_string_length != 0) {
        pvVar8 = std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::
                 at(*(vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_> **
                     )((long)userdata + 0x70),__n);
        std::__cxx11::string::assign((char *)&pvVar8->sourceName);
        bVar1 = (i->sample_spec).channels;
        pvVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                           (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                             ((long)userdata + 0x78),__n);
        pvVar6->inputChannels = (uint)bVar1;
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)userdata + 0x28),i->name);
        pvVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                           (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                             ((long)userdata + 0x78),__n);
        pvVar6->isDefaultInput = bVar4;
        pvVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                           (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                             ((long)userdata + 0x78),__n);
        uVar2 = pvVar6->inputChannels;
        pvVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                           (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                             ((long)userdata + 0x78),__n);
        if (uVar2 < pvVar6->outputChannels) {
          pvVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                             (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **
                               )((long)userdata + 0x78),__n);
          puVar9 = &pvVar6->inputChannels;
        }
        else {
          pvVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                             (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **
                               )((long)userdata + 0x78),__n);
          puVar9 = &pvVar6->outputChannels;
        }
        uVar2 = *puVar9;
        pvVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                           (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                             ((long)userdata + 0x78),__n);
        pvVar6->duplexChannels = uVar2;
      }
      goto LAB_00111a13;
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

static void rt_pa_set_source_info_and_quit( pa_context * /*c*/, const pa_source_info *i,
                                            int eol, void *userdata )
{
  PaDeviceProbeInfo *paProbeInfo = static_cast<PaDeviceProbeInfo *>( userdata );
  if ( eol ) {
    paProbeInfo->paMainLoopApi->quit( paProbeInfo->paMainLoopApi, 0 );
    return;
  }

  std::string name = pa_proplist_gets( i->proplist, "device.description" );
  paProbeInfo->deviceNames.push_back( name );
  for ( size_t n=0; n<paProbeInfo->rtDeviceList->size(); n++ ) {
    if ( paProbeInfo->rtDeviceList->at(n).name == name ) {
      // Check if we've already probed this as an output.
      if ( !paProbeInfo->paDeviceList->at(n).sinkName.empty() ) {
        // This must be a duplex device. Update the device info.
        paProbeInfo->paDeviceList->at(n).sourceName = i->name;
        paProbeInfo->rtDeviceList->at(n).inputChannels = i->sample_spec.channels;
        paProbeInfo->rtDeviceList->at(n).isDefaultInput = ( paProbeInfo->defaultSourceName == i->name );
        paProbeInfo->rtDeviceList->at(n).duplexChannels = 
          (paProbeInfo->rtDeviceList->at(n).inputChannels < paProbeInfo->rtDeviceList->at(n).outputChannels)
          ? paProbeInfo->rtDeviceList->at(n).inputChannels : paProbeInfo->rtDeviceList->at(n).outputChannels;
      }
      return; // we already have this
    }
  }

  RtAudio::DeviceInfo info;
  info.name = name;
  info.inputChannels = i->sample_spec.channels;
  info.preferredSampleRate = i->sample_spec.rate;
  info.isDefaultInput = ( paProbeInfo->defaultSourceName == i->name );
  for ( const unsigned int *sr = SUPPORTED_SAMPLERATES; *sr; ++sr )
    info.sampleRates.push_back( *sr );
  for ( const rtaudio_pa_format_mapping_t *fm = supported_sampleformats; fm->rtaudio_format; ++fm )
    info.nativeFormats |= fm->rtaudio_format;
  info.ID = *(paProbeInfo->currentDeviceId);
  *(paProbeInfo->currentDeviceId) = info.ID + 1;
  paProbeInfo->rtDeviceList->push_back( info );

  RtApiPulse::PaDeviceInfo painfo;
  painfo.sourceName = i->name;
  paProbeInfo->paDeviceList->push_back( painfo );
}